

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCursorNextPage(lhash_kv_cursor *pPtr)

{
  int iVar1;
  int in_R8D;
  lhash_bmap_rec *plVar2;
  lhpage *pPage;
  lhpage *local_20;
  
  plVar2 = pPtr->pRec;
  if (plVar2 != (lhash_bmap_rec *)0x0) {
    do {
      if ((pPtr->iState == 2) && (pPtr->pRaw != (unqlite_page *)0x0)) {
        (*pPtr->pStore->pIo->xPageUnref)(pPtr->pRaw);
        pPtr->pRaw = (unqlite_page *)0x0;
      }
      pPtr->pRec = plVar2->pPrev;
      iVar1 = lhLoadPage((lhash_kv_engine *)pPtr->pStore,plVar2->iReal,(lhpage *)0x0,&local_20,
                         in_R8D);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_20->pList != (lhcell *)0x0) {
        pPtr->pCell = local_20->pList;
        pPtr->iState = 2;
        pPtr->pRaw = local_20->pRaw;
        return 0;
      }
      (*local_20->pHash->pIo->xPageUnref)(local_20->pRaw);
      plVar2 = pPtr->pRec;
    } while (plVar2 != (lhash_bmap_rec *)0x0);
  }
  pPtr->iState = 3;
  return -0x1c;
}

Assistant:

static int lhCursorNextPage(lhash_kv_cursor *pPtr)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pPtr;
	lhash_bmap_rec *pRec;
	lhpage *pPage;
	int rc;
	for(;;){
		pRec = pCur->pRec;
		if( pRec == 0 ){
			pCur->iState = L_HASH_CURSOR_STATE_DONE;
			return UNQLITE_DONE;
		}
		if( pPtr->iState == L_HASH_CURSOR_STATE_CELL && pPtr->pRaw ){
			/* Unref this page */
			pCur->pStore->pIo->xPageUnref(pPtr->pRaw);
			pPtr->pRaw = 0;
		}
		/* Advance the map cursor */
		pCur->pRec = pRec->pPrev; /* Not a bug, reverse link */
		/* Load the next page on the list */
		rc = lhLoadPage((lhash_kv_engine *)pCur->pStore,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pPage->pList ){
			/* Reflect the change */
			pCur->pCell = pPage->pList;
			pCur->iState = L_HASH_CURSOR_STATE_CELL;
			pCur->pRaw = pPage->pRaw;
			break;
		}
		/* Empty page, discard this page and continue */
		pPage->pHash->pIo->xPageUnref(pPage->pRaw);
	}
	return UNQLITE_OK;
}